

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O2

CommandOptions * read_isxd_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  MDD_t MVar7;
  int iVar8;
  long *plVar9;
  undefined8 uVar10;
  AESDecContext *this;
  HMACContext *this_00;
  IFileReaderFactory *in_RDX;
  uint uVar11;
  _List_node_base *p_Var12;
  allocator<char> local_361;
  AESDecContext *local_360;
  MXFReader Reader;
  ui32_t write_count;
  FrameBuffer FrameBuffer;
  uint *local_328;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  object_list;
  bool local_2c7;
  string local_208 [32];
  FileWriter OutFile;
  allocator<char> local_1b0 [104];
  char name_format [64];
  undefined1 local_100 [208];
  
  AS_02::ISXD::MXFReader::MXFReader(&Reader,in_RDX);
  ASDCP::FrameBuffer::FrameBuffer(&FrameBuffer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&object_list,(char *)fileReaderFactory[0xb]._vptr_IFileReaderFactory,
             local_1b0);
  AS_02::ISXD::MXFReader::OpenRead((string *)Options);
  std::__cxx11::string::~string((string *)&object_list);
  iVar1._0_1_ = Options->error_flag;
  iVar1._1_1_ = Options->key_flag;
  iVar1._2_1_ = Options->read_hmac;
  iVar1._3_1_ = Options->split_wav;
  if (iVar1 < 0) {
    uVar6 = 0;
  }
  else {
    ASDCP::FrameBuffer::Capacity((uint)&object_list);
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&object_list);
    Kumu::Result_t::~Result_t((Result_t *)&object_list);
    AS_02::ISXD::MXFReader::AS02IndexReader();
    uVar6 = AS_02::MXF::AS02IndexReader::GetDuration();
    iVar2._0_1_ = Options->error_flag;
    iVar2._1_1_ = Options->key_flag;
    iVar2._2_1_ = Options->read_hmac;
    iVar2._3_1_ = Options->split_wav;
    if (-1 < iVar2) {
      object_list.
      super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
      ._M_impl._M_node._M_size = 0;
      object_list.
      super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&object_list;
      object_list.
      super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&object_list;
      plVar9 = (long *)AS_02::ISXD::MXFReader::OP1aHeader();
      MVar7 = ASDCP::DefaultSMPTEDict();
      uVar10 = ASDCP::Dictionary::Type(MVar7);
      (**(code **)(*plVar9 + 0xb0))(local_100 + 0x68,plVar9,uVar10,(_List_node_base *)&object_list);
      Kumu::Result_t::~Result_t((Result_t *)(local_100 + 0x68));
      p_Var12 = (_List_node_base *)&object_list;
      while (p_Var12 = (((_List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                          *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var12 != (_List_node_base *)&object_list) {
        if ((p_Var12[1]._M_next == (_List_node_base *)0x0) ||
           (plVar9 = (long *)__dynamic_cast(p_Var12[1]._M_next,
                                            &ASDCP::MXF::InterchangeObject::typeinfo,
                                            &ASDCP::MXF::GenericStreamTextBasedSet::typeinfo,0),
           plVar9 == (long *)0x0)) {
          __assert_fail("text_object",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-unwrap.cpp"
                        ,0x387,
                        "Result_t read_isxd_file(CommandOptions &, const Kumu::IFileReaderFactory &)"
                       );
        }
        (**(code **)(*plVar9 + 0x88))(plVar9,_stderr);
      }
      std::__cxx11::
      _List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
      ::_M_clear(&object_list.
                  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                );
      iVar3._0_1_ = Options->error_flag;
      iVar3._1_1_ = Options->key_flag;
      iVar3._2_1_ = Options->read_hmac;
      iVar3._3_1_ = Options->split_wav;
      if (iVar3 < 0) {
        local_360 = (AESDecContext *)0x0;
        goto LAB_00109fbe;
      }
      if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 1) == '\x01') {
        this = (AESDecContext *)operator_new(8);
        ASDCP::AESDecContext::AESDecContext(this);
        ASDCP::AESDecContext::InitKey((uchar *)&object_list);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&object_list);
        Kumu::Result_t::~Result_t((Result_t *)&object_list);
        iVar4._0_1_ = Options->error_flag;
        iVar4._1_1_ = Options->key_flag;
        iVar4._2_1_ = Options->read_hmac;
        iVar4._3_1_ = Options->split_wav;
        local_360 = this;
        if ((-1 < iVar4) &&
           (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 2) == '\x01')) {
          ASDCP::WriterInfo::WriterInfo((WriterInfo *)&object_list);
          AS_02::ISXD::MXFReader::FillWriterInfo((WriterInfo *)local_100);
          Kumu::Result_t::~Result_t((Result_t *)local_100);
          if (local_2c7 == true) {
            this_00 = (HMACContext *)operator_new(8);
            ASDCP::HMACContext::HMACContext(this_00);
            ASDCP::HMACContext::InitKey((uchar *)local_1b0,(LabelSet_t)this_00);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_1b0);
            Kumu::Result_t::~Result_t((Result_t *)local_1b0);
          }
          else {
            fputs("File does not contain HMAC values, ignoring -m option.\n",_stderr);
          }
          ASDCP::WriterInfo::~WriterInfo((WriterInfo *)&object_list);
        }
        goto LAB_00109fbe;
      }
    }
  }
  local_360 = (AESDecContext *)0x0;
LAB_00109fbe:
  uVar11 = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
  if (*(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory == 0) {
    uVar11 = uVar6;
  }
  uVar11 = uVar11 + *(int *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
  if (uVar6 <= uVar11) {
    uVar11 = uVar6;
  }
  snprintf(name_format,0x40,"%%s%%0%du.%s",
           (ulong)*(uint *)&fileReaderFactory[2]._vptr_IFileReaderFactory,
           fileReaderFactory[0xc]._vptr_IFileReaderFactory);
  iVar8._0_1_ = Options->error_flag;
  iVar8._1_1_ = Options->key_flag;
  iVar8._2_1_ = Options->read_hmac;
  iVar8._3_1_ = Options->split_wav;
  for (uVar6 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
      (-1 < iVar8 && (uVar6 < uVar11)); uVar6 = uVar6 + 1) {
    AS_02::ISXD::MXFReader::ReadFrame
              ((uint)(Result_t *)&object_list,(FrameBuffer *)&Reader,(AESDecContext *)(ulong)uVar6,
               (HMACContext *)&FrameBuffer);
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&object_list);
    Kumu::Result_t::~Result_t((Result_t *)&object_list);
    iVar8._0_1_ = Options->error_flag;
    iVar8._1_1_ = Options->key_flag;
    iVar8._2_1_ = Options->read_hmac;
    iVar8._3_1_ = Options->split_wav;
    if ((-1 < iVar8) &&
       (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 4) == '\0')) {
      Kumu::FileWriter::FileWriter(&OutFile);
      snprintf((char *)&object_list,0x100,name_format,fileReaderFactory[6]._vptr_IFileReaderFactory,
               (ulong)uVar6);
      std::__cxx11::string::string<std::allocator<char>>(local_208,(char *)&object_list,&local_361);
      Kumu::FileWriter::OpenWrite((string *)local_1b0);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_1b0);
      Kumu::Result_t::~Result_t((Result_t *)local_1b0);
      std::__cxx11::string::~string(local_208);
      iVar5._0_1_ = Options->error_flag;
      iVar5._1_1_ = Options->key_flag;
      iVar5._2_1_ = Options->read_hmac;
      iVar5._3_1_ = Options->split_wav;
      if (-1 < iVar5) {
        Kumu::FileWriter::Write((uchar *)local_1b0,(uint)&OutFile,local_328);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_1b0);
        Kumu::Result_t::~Result_t((Result_t *)local_1b0);
      }
      Kumu::FileWriter::~FileWriter(&OutFile);
      iVar8._0_1_ = Options->error_flag;
      iVar8._1_1_ = Options->key_flag;
      iVar8._2_1_ = Options->read_hmac;
      iVar8._3_1_ = Options->split_wav;
    }
  }
  ASDCP::FrameBuffer::~FrameBuffer(&FrameBuffer);
  AS_02::ISXD::MXFReader::~MXFReader(&Reader);
  return Options;
}

Assistant:

Result_t
read_isxd_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*     Context = 0;
  HMACContext*       HMAC = 0;
  AS_02::ISXD::MXFReader    Reader(fileReaderFactory);
  ASDCP::FrameBuffer  FrameBuffer;
  ui32_t             frame_count = 0;

  Result_t result = Reader.OpenRead(Options.input_filename);

  if ( ASDCP_SUCCESS(result) )
    {
      result = FrameBuffer.Capacity(Options.fb_size);
      frame_count = Reader.AS02IndexReader().GetDuration();
    }

  if ( ASDCP_SUCCESS(result) )
    {
      std::list<MXF::InterchangeObject*> object_list;
      Reader.OP1aHeader().GetMDObjectsByType(DefaultSMPTEDict().ul(MDD_GenericStreamTextBasedSet), object_list);

      std::list<MXF::InterchangeObject*>::iterator i;
      for ( i = object_list.begin(); i != object_list.end(); ++i )
	{
	  MXF::GenericStreamTextBasedSet *text_object = dynamic_cast<MXF::GenericStreamTextBasedSet*>(*i);
	  assert(text_object);
	  text_object->Dump(stderr);
	}
    }

#ifdef HAVE_OPENSSL
  if ( ASDCP_SUCCESS(result) && Options.key_flag )
    {
      Context = new AESDecContext;
      result = Context->InitKey(Options.key_value);

      if ( ASDCP_SUCCESS(result) && Options.read_hmac )
	{
	  WriterInfo Info;
	  Reader.FillWriterInfo(Info);

	  if ( Info.UsesHMAC )
	    {
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	  else
	    {
	      fputs("File does not contain HMAC values, ignoring -m option.\n", stderr);
	    }
	}
    }
#endif // HAVE_OPENSSL

  ui32_t last_frame = Options.start_frame + ( Options.duration ? Options.duration : frame_count);
  if ( last_frame > frame_count )
    last_frame = frame_count;

  char name_format[64];
  snprintf(name_format,  64, "%%s%%0%du.%s", Options.number_width, Options.extension);

  for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
      result = Reader.ReadFrame(i, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( ! Options.no_write_flag )
	    {
	      Kumu::FileWriter OutFile;
	      char filename[256];
	      ui32_t write_count;
	      snprintf(filename, 256, name_format, Options.file_prefix, i);
	      result = OutFile.OpenWrite(filename);

	      if ( ASDCP_SUCCESS(result) )
		result = OutFile.Write(FrameBuffer.Data(), FrameBuffer.Size(), &write_count);
	    }
	}
    }

  return result;
}